

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O3

vec3f __thiscall MT19937Sampler::sampleUnitSphereSurface(MT19937Sampler *this)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3f vVar5;
  
  do {
    do {
      (**(this->super_Sampler)._vptr_Sampler)(this);
      (**(this->super_Sampler)._vptr_Sampler)(this);
      fVar2 = extraout_XMM0_Da + extraout_XMM0_Da + -1.0;
      fVar4 = extraout_XMM0_Da_00 + extraout_XMM0_Da_00 + -1.0;
      (**(this->super_Sampler)._vptr_Sampler)(this);
      fVar3 = extraout_XMM0_Da_01 + extraout_XMM0_Da_01 + -1.0;
      fVar1 = SQRT(fVar3 * fVar3 + fVar2 * fVar2 + fVar4 * fVar4);
    } while (1.0 < fVar1);
  } while (fVar1 < 0.001);
  fVar1 = 1.0 / fVar1;
  vVar5.z = fVar3 * fVar1;
  vVar5.y = fVar4 * fVar1;
  vVar5.x = fVar2 * fVar1;
  return vVar5;
}

Assistant:

vec3f sampleUnitSphereSurface() {
		// TODO optimize
		vec3f v;
		do v = vec3f(get1f()*2-1, get1f()*2-1, get1f()*2-1);
		while (norm(v)>1 || norm(v)<1e-3);
		return normalized(v);
	}